

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O2

float float_of_substring(substring s)

{
  ostream *poVar1;
  char *pcVar2;
  char *p;
  anon_union_4_2_947300a4 x;
  float fVar3;
  char *endptr;
  char *local_48 [2];
  char local_38 [16];
  char *local_28;
  
  pcVar2 = s.end;
  p = s.begin;
  local_28 = pcVar2;
  fVar3 = parseFloat(p,&local_28,(char *)0x0);
  if ((p != pcVar2 && local_28 == p) || ((~(uint)fVar3 & 0x7fc00000) == 0)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"warning: ");
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,p,pcVar2);
    poVar1 = std::operator<<(poVar1,local_48[0]);
    poVar1 = std::operator<<(poVar1," is not a good float, replacing with 0");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)local_48);
    fVar3 = 0.0;
  }
  return fVar3;
}

Assistant:

inline float float_of_substring(substring s)
{
  char* endptr = s.end;
  float f = parseFloat(s.begin, &endptr);
  if ((endptr == s.begin && s.begin != s.end) || nanpattern(f))
  {
    std::cout << "warning: " << std::string(s.begin, s.end - s.begin).c_str()
              << " is not a good float, replacing with 0" << std::endl;
    f = 0;
  }
  return f;
}